

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::SGXMLScanner::laxElementValidation
          (SGXMLScanner *this,QName *element,ContentLeafNameTypeVector *cv,XMLContentModel *cm,
          XMLSize_t parentElemDepth)

{
  XMLCh XVar1;
  XMLCh XVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  NodeTypes NVar6;
  uint uVar7;
  XMLSize_t XVar8;
  QName *exemplar;
  XMLCh *pXVar9;
  XMLCh *pXVar10;
  XMLSize_t pos;
  bool bVar11;
  SubstitutionGroupComparator comparator;
  SubstitutionGroupComparator local_40;
  
  uVar3 = this->fElemState[parentElemDepth];
  if (uVar3 != 0xffffffff) {
    uVar4 = element->fURIId;
    uVar5 = this->fElemLoopState[parentElemDepth];
    local_40.fGrammarResolver = (this->super_XMLScanner).fGrammarResolver;
    local_40.fStringPool = (this->super_XMLScanner).fURIStringPool;
    uVar7 = 0;
    if (cv != (ContentLeafNameTypeVector *)0x0) {
      XVar8 = ContentLeafNameTypeVector::getLeafCount(cv);
      if (XVar8 == 0) {
        pos = 0;
LAB_002b0c6d:
        if (pos != XVar8) {
          NVar6 = ContentLeafNameTypeVector::getLeafTypeAt(cv,pos);
          if ((uint)((NVar6 & (Any_NS|Any_Other)) + ~Sequence) < 3) {
            if ((uint)(NVar6 + ~(ModelGroupChoice|ZeroOrOne)) < 3) {
              this->fElemState[parentElemDepth] = uVar7;
              this->fElemLoopState[parentElemDepth] = uVar5;
              (this->super_XMLScanner).fValidate = false;
              (this->super_XMLScanner).fElemStack.fStack
              [(this->super_XMLScanner).fElemStack.fStackTop - 1]->fValidationFlag = false;
              return false;
            }
            bVar11 = (uint)(NVar6 + ~ModelGroupSequence) < 3;
          }
          else {
            bVar11 = false;
          }
          this->fElemState[parentElemDepth] = uVar7;
          this->fElemLoopState[parentElemDepth] = uVar5;
          return bVar11;
        }
      }
      else {
        pos = 0;
        do {
          exemplar = ContentLeafNameTypeVector::getLeafNameAt(cv,pos);
          uVar7 = exemplar->fURIId;
          NVar6 = ContentLeafNameTypeVector::getLeafTypeAt(cv,pos);
          if (NVar6 == Leaf) {
            if (uVar7 == uVar4) {
              pXVar10 = exemplar->fLocalPart;
              pXVar9 = element->fLocalPart;
              if (pXVar10 == pXVar9) goto LAB_002b0c41;
              if (pXVar9 != (XMLCh *)0x0 && pXVar10 != (XMLCh *)0x0) {
                do {
                  XVar1 = *pXVar10;
                  if (XVar1 == L'\0') goto LAB_002b0c25;
                  pXVar10 = pXVar10 + 1;
                  XVar2 = *pXVar9;
                  pXVar9 = pXVar9 + 1;
                } while (XVar1 == XVar2);
                goto LAB_002b0c2b;
              }
              if (pXVar10 == (XMLCh *)0x0) {
                if (pXVar9 == (XMLCh *)0x0) goto LAB_002b0c41;
LAB_002b0c25:
                XVar1 = *pXVar9;
              }
              else {
                XVar1 = *pXVar10;
                if ((pXVar9 != (XMLCh *)0x0) && (XVar1 == L'\0')) goto LAB_002b0c25;
              }
              if (XVar1 != L'\0') goto LAB_002b0c2b;
            }
            else {
LAB_002b0c2b:
              bVar11 = SubstitutionGroupComparator::isEquivalentTo(&local_40,element,exemplar);
              if (!bVar11) goto LAB_002b0c57;
            }
LAB_002b0c41:
            uVar7 = (*cm->_vptr_XMLContentModel[6])(cm,(ulong)uVar3,pos);
            if (uVar7 != 0xffffffff) goto LAB_002b0c6d;
          }
          else {
            NVar6 = NVar6 & (Any_NS|Any_Other);
            if (NVar6 == Any_NS) {
              if (uVar7 == uVar4) goto LAB_002b0c41;
            }
            else if (NVar6 == Any_Other) {
              if ((uVar7 != uVar4) && (uVar4 != (this->super_XMLScanner).fEmptyNamespaceId))
              goto LAB_002b0c41;
            }
            else if (NVar6 == Any) goto LAB_002b0c41;
          }
LAB_002b0c57:
          pos = pos + 1;
        } while (pos != XVar8);
      }
      this->fElemState[parentElemDepth] = 0xffffffff;
      this->fElemLoopState[parentElemDepth] = 0;
    }
  }
  return false;
}

Assistant:

bool SGXMLScanner::laxElementValidation(QName* element, ContentLeafNameTypeVector* cv,
                                        const XMLContentModel* const cm,
                                        const XMLSize_t parentElemDepth)
{
    bool skipThisOne = false;
    bool laxThisOne = false;
    unsigned int elementURI = element->getURI();
    unsigned int currState = fElemState[parentElemDepth];
    unsigned int currLoop = fElemLoopState[parentElemDepth];

    if (currState == XMLContentModel::gInvalidTrans) {
        return laxThisOne;
    }

    SubstitutionGroupComparator comparator(fGrammarResolver, fURIStringPool);

    if (cv) {
        XMLSize_t i = 0;
        XMLSize_t leafCount = cv->getLeafCount();
        unsigned int nextState = 0;

        for (; i < leafCount; i++) {

            QName* fElemMap = cv->getLeafNameAt(i);
            unsigned int uri = fElemMap->getURI();
            ContentSpecNode::NodeTypes type = cv->getLeafTypeAt(i);

            if (type == ContentSpecNode::Leaf) {
                if (((uri == elementURI)
                      && XMLString::equals(fElemMap->getLocalPart(), element->getLocalPart()))
                    || comparator.isEquivalentTo(element, fElemMap)) {

                    nextState = cm->getNextState(currState, i);

                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            } else if ((type & 0x0f) == ContentSpecNode::Any) {
                nextState = cm->getNextState(currState, i);
                if (nextState != XMLContentModel::gInvalidTrans)
                    break;
            }
            else if ((type & 0x0f) == ContentSpecNode::Any_Other) {
                if (uri != elementURI && elementURI != fEmptyNamespaceId) {
                    nextState = cm->getNextState(currState, i);
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            }
            else if ((type & 0x0f) == ContentSpecNode::Any_NS) {
                if (uri == elementURI) {
                    nextState = cm->getNextState(currState, i);
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            }

        } // for

        if (i == leafCount) { // no match
            fElemState[parentElemDepth] = XMLContentModel::gInvalidTrans;
            fElemLoopState[parentElemDepth] = 0;
            return laxThisOne;
        }

        ContentSpecNode::NodeTypes type = cv->getLeafTypeAt(i);
        if ((type & 0x0f) == ContentSpecNode::Any ||
            (type & 0x0f) == ContentSpecNode::Any_Other ||
            (type & 0x0f) == ContentSpecNode::Any_NS)
        {
            if (type == ContentSpecNode::Any_Skip ||
                type == ContentSpecNode::Any_NS_Skip ||
                type == ContentSpecNode::Any_Other_Skip) {
                skipThisOne = true;
            }
            else if (type == ContentSpecNode::Any_Lax ||
                     type == ContentSpecNode::Any_NS_Lax ||
                     type == ContentSpecNode::Any_Other_Lax) {
                laxThisOne = true;
            }
        }
        fElemState[parentElemDepth] = nextState;
        fElemLoopState[parentElemDepth] = currLoop;
    } // if

    if (skipThisOne) {
        fValidate = false;
        fElemStack.setValidationFlag(fValidate);
    }

    return laxThisOne;
}